

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_normdev(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_INT local_1b4;
  REF_INT local_1b0;
  int local_1ac;
  REF_INT local_1a8;
  REF_INT local_1a4;
  int local_1a0;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL new_uv_area;
  REF_DBL orig_uv_area;
  REF_DBL sign_uv_area;
  REF_DBL new_dev;
  REF_DBL orig_dev;
  int local_138;
  REF_BOOL supported;
  REF_BOOL node1_support;
  REF_BOOL node0_support;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_BOOL will_be_collapsed;
  REF_INT node;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  _node1_support = ref_grid->geom;
  ref_grid_local._4_4_ = ref_geom_supported(_node1_support,node0,&supported);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_geom_supported(_node1_support,node1,&local_138);
    if (ref_grid_local._4_4_ == 0) {
      if ((((_node1_support->model == (void *)0x0) && (_node1_support->meshlink == (void *)0x0)) ||
          (supported == 0)) || (local_138 == 0)) {
        *allowed = 1;
        ref_grid_local._4_4_ = 0;
      }
      else {
        *allowed = 0;
        pRVar1 = ref_grid->cell[3];
        if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
          local_1a0 = -1;
        }
        else {
          local_1a0 = pRVar1->ref_adj->first[node1];
        }
        local_34 = local_1a0;
        if (local_1a0 == -1) {
          local_1a4 = -1;
        }
        else {
          local_1a4 = pRVar1->ref_adj->item[local_1a0].ref;
        }
        nodes[0x1a] = local_1a4;
        while (local_34 != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],new_nodes + 0x1a);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x3b8,"ref_collapse_edge_normdev",(ulong)uVar2,"nodes");
            return uVar2;
          }
          uVar2 = ref_geom_tri_supported
                            (_node1_support,new_nodes + 0x1a,(REF_BOOL *)((long)&orig_dev + 4));
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x3ba,"ref_collapse_edge_normdev",(ulong)uVar2,"tri support");
            return uVar2;
          }
          if (orig_dev._4_4_ != 0) {
            ref_node._0_4_ = 0;
            for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar1->node_per;
                ref_node._4_4_ = ref_node._4_4_ + 1) {
              if (node0 == new_nodes[(long)ref_node._4_4_ + 0x1a]) {
                ref_node._0_4_ = 1;
              }
            }
            if ((int)ref_node == 0) {
              for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar1->node_per;
                  ref_node._4_4_ = ref_node._4_4_ + 1) {
                (&will_be_collapsed)[ref_node._4_4_] = new_nodes[(long)ref_node._4_4_ + 0x1a];
                if (node1 == (&will_be_collapsed)[ref_node._4_4_]) {
                  (&will_be_collapsed)[ref_node._4_4_] = node0;
                }
              }
              (&will_be_collapsed)[pRVar1->node_per] = new_nodes[(long)pRVar1->node_per + 0x1a];
              uVar2 = ref_geom_cell_tuv_supported
                                (_node1_support,new_nodes + 0x1a,2,(REF_BOOL *)((long)&orig_dev + 4)
                                );
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x3cc,"ref_collapse_edge_normdev",(ulong)uVar2,
                       "tuv support for original configuration");
                return uVar2;
              }
              if (orig_dev._4_4_ == 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x3ce,"ref_collapse_edge_normdev",
                       "original configuration before collapse does not support cell tuv");
                return 1;
              }
              uVar2 = ref_geom_tri_norm_deviation(ref_grid,new_nodes + 0x1a,&new_dev);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x3cf,"ref_collapse_edge_normdev",(ulong)uVar2,"orig");
                return uVar2;
              }
              uVar2 = ref_geom_cell_tuv_supported
                                (_node1_support,&will_be_collapsed,2,
                                 (REF_BOOL *)((long)&orig_dev + 4));
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x3d2,"ref_collapse_edge_normdev",(ulong)uVar2,
                       "tuv support for swapped configuration");
                return uVar2;
              }
              if (orig_dev._4_4_ == 0) {
                *allowed = 0;
                return 0;
              }
              RVar3 = ref_geom_tri_norm_deviation(ref_grid,&will_be_collapsed,&sign_uv_area);
              if (RVar3 != 0) {
                *allowed = 0;
                return 0;
              }
              if ((sign_uv_area < ref_grid->adapt->post_min_normdev) && (sign_uv_area < new_dev)) {
                *allowed = 0;
                return 0;
              }
            }
          }
          local_34 = pRVar1->ref_adj->item[local_34].next;
          if (local_34 == -1) {
            local_1a8 = -1;
          }
          else {
            local_1a8 = pRVar1->ref_adj->item[local_34].ref;
          }
          nodes[0x1a] = local_1a8;
        }
        if (ref_grid->geom->meshlink == (void *)0x0) {
          pRVar1 = ref_grid->cell[3];
          if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
            local_1ac = -1;
          }
          else {
            local_1ac = pRVar1->ref_adj->first[node1];
          }
          local_34 = local_1ac;
          if (local_1ac == -1) {
            local_1b0 = -1;
          }
          else {
            local_1b0 = pRVar1->ref_adj->item[local_1ac].ref;
          }
          nodes[0x1a] = local_1b0;
          while (local_34 != -1) {
            uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],new_nodes + 0x1a);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x3ec,"ref_collapse_edge_normdev",(ulong)uVar2,"nodes");
              return uVar2;
            }
            ref_node._0_4_ = 0;
            for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar1->node_per;
                ref_node._4_4_ = ref_node._4_4_ + 1) {
              if (node0 == new_nodes[(long)ref_node._4_4_ + 0x1a]) {
                ref_node._0_4_ = 1;
              }
            }
            if ((int)ref_node == 0) {
              for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar1->node_per;
                  ref_node._4_4_ = ref_node._4_4_ + 1) {
                (&will_be_collapsed)[ref_node._4_4_] = new_nodes[(long)ref_node._4_4_ + 0x1a];
                if (node1 == (&will_be_collapsed)[ref_node._4_4_]) {
                  (&will_be_collapsed)[ref_node._4_4_] = node0;
                }
              }
              (&will_be_collapsed)[pRVar1->node_per] = new_nodes[(long)pRVar1->node_per + 0x1a];
              uVar2 = ref_geom_cell_tuv_supported
                                (_node1_support,new_nodes + 0x1a,2,(REF_BOOL *)((long)&orig_dev + 4)
                                );
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x3fe,"ref_collapse_edge_normdev",(ulong)uVar2,
                       "tuv support for original configuration");
                return uVar2;
              }
              if (orig_dev._4_4_ == 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x400,"ref_collapse_edge_normdev",
                       "original configuration before collapse does not support cell tuv");
                return 1;
              }
              uVar2 = ref_geom_cell_tuv_supported
                                (_node1_support,&will_be_collapsed,2,
                                 (REF_BOOL *)((long)&orig_dev + 4));
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x403,"ref_collapse_edge_normdev",(ulong)uVar2,
                       "tuv support for swapped configuration");
                return uVar2;
              }
              if (orig_dev._4_4_ == 0) {
                *allowed = 0;
                return 0;
              }
              uVar2 = ref_geom_uv_area_sign
                                (ref_grid,new_nodes[(long)pRVar1->node_per + 0x1a],&orig_uv_area);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x40a,"ref_collapse_edge_normdev",(ulong)uVar2,"sign");
                return uVar2;
              }
              uVar2 = ref_geom_uv_area(_node1_support,new_nodes + 0x1a,&new_uv_area);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x40b,"ref_collapse_edge_normdev",(ulong)uVar2,"uv area");
                return uVar2;
              }
              uVar2 = ref_geom_uv_area(_node1_support,&will_be_collapsed,
                                       (REF_DBL *)&ref_private_macro_code_rss_1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x40c,"ref_collapse_edge_normdev",(ulong)uVar2,"uv area");
                return uVar2;
              }
              if ((orig_uv_area * _ref_private_macro_code_rss_1 <= *(double *)&ref_geom->manifold)
                 && (orig_uv_area * _ref_private_macro_code_rss_1 < orig_uv_area * new_uv_area)) {
                *allowed = 0;
                return 0;
              }
            }
            local_34 = pRVar1->ref_adj->item[local_34].next;
            if (local_34 == -1) {
              local_1b4 = -1;
            }
            else {
              local_1b4 = pRVar1->ref_adj->item[local_34].ref;
            }
            nodes[0x1a] = local_1b4;
          }
          *allowed = 1;
          ref_grid_local._4_4_ = 0;
        }
        else {
          *allowed = 1;
          ref_grid_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x3ad,"ref_collapse_edge_normdev",(ulong)ref_grid_local._4_4_,"support1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x3ac,"ref_collapse_edge_normdev",(ulong)ref_grid_local._4_4_,"support0");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_normdev(REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;

  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_support, node1_support, supported;
  REF_DBL orig_dev, new_dev;
  REF_DBL sign_uv_area, orig_uv_area, new_uv_area;

  RSS(ref_geom_supported(ref_geom, node0, &node0_support), "support0");
  RSS(ref_geom_supported(ref_geom, node1, &node1_support), "support1");
  if (!(ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) ||
      !node0_support || !node1_support) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, check by same normal */

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &orig_dev), "orig");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    if (REF_SUCCESS !=
        ref_geom_tri_norm_deviation(ref_grid, new_nodes, &new_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    /* allow if improvement */
    if ((new_dev < ref_grid_adapt(ref_grid, post_min_normdev)) &&
        (new_dev < orig_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    /* see if new config is below limit */
    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                              &sign_uv_area),
        "sign");
    RSS(ref_geom_uv_area(ref_geom, nodes, &orig_uv_area), "uv area");
    RSS(ref_geom_uv_area(ref_geom, new_nodes, &new_uv_area), "uv area");
    /* allow if improvement */
    if ((sign_uv_area * new_uv_area <= ref_node_min_uv_area(ref_node)) &&
        (sign_uv_area * new_uv_area < sign_uv_area * orig_uv_area)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}